

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O3

int cfg_schema_tobin_tokens(cfg_schema_entry *s_entry,const_strarray *value,void *reference)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  
  __s = value->value;
  if (s_entry->list == true) {
    sVar2 = strlen(__s);
    if (sVar2 < value->length) {
      return -1;
    }
  }
  iVar1 = cfg_tobin_tokens(reference,__s,(cfg_schema_entry *)s_entry->validate_param[0].ptr,
                           s_entry->validate_param[1].s,
                           (cfg_schema_token_customizer *)s_entry->validate_param[2].ptr);
  return iVar1;
}

Assistant:

int
cfg_schema_tobin_tokens(const struct cfg_schema_entry *s_entry, const struct const_strarray *value, void *reference) {
  if (s_entry->list && strlen(value->value) < value->length) {
    /* we don't support direct list conversion to binary */
    return -1;
  }
  return cfg_tobin_tokens(reference, strarray_get_first_c(value), s_entry->validate_param[0].ptr,
    s_entry->validate_param[1].s, s_entry->validate_param[2].ptr);
}